

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O3

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats)

{
  Vec3ff *pVVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  float local_48 [6];
  
  renderPixelStandard((embree *)local_48,data,(float)x,(float)y,camera,stats);
  uVar3 = width * y + x;
  pVVar1 = data->g_accu + uVar3;
  local_48[0] = local_48[0] + (pVVar1->field_0).m128[0];
  fVar4 = (float)local_48._4_8_ + (pVVar1->field_0).m128[1];
  fVar5 = SUB84(local_48._4_8_,4) + (pVVar1->field_0).m128[2];
  fVar6 = (pVVar1->field_0).m128[3] + 1.0;
  fVar7 = fVar6;
  if (fVar6 <= 1.0) {
    fVar7 = 1.0;
  }
  auVar10._4_4_ = fVar6;
  auVar10._0_4_ = fVar7;
  auVar10._8_4_ = fVar6;
  auVar10._12_4_ = fVar6;
  auVar11._4_4_ = fVar6;
  auVar11._0_4_ = fVar7;
  auVar11._8_4_ = fVar6;
  auVar11._12_4_ = fVar6;
  auVar11 = rcpss(auVar10,auVar11);
  fVar12 = (2.0 - fVar7 * auVar11._0_4_) * auVar11._0_4_;
  fVar7 = local_48[0] * fVar12;
  if (1.0 <= fVar7) {
    fVar7 = 1.0;
  }
  fVar2 = 0.0;
  if (0.0 <= fVar7) {
    fVar2 = fVar7;
  }
  pVVar1 = data->g_accu + uVar3;
  (pVVar1->field_0).m128[0] = local_48[0];
  (pVVar1->field_0).m128[1] = fVar4;
  (pVVar1->field_0).m128[2] = fVar5;
  (pVVar1->field_0).m128[3] = fVar6;
  auVar13._0_4_ = fVar12 * fVar4;
  auVar13._4_4_ = fVar12 * fVar5;
  auVar13._8_4_ = fVar12 * fVar5;
  auVar13._12_4_ = fVar12 * fVar6;
  auVar11 = minps(auVar13,_DAT_0024aa90);
  auVar11 = maxps(ZEXT816(0),auVar11);
  fVar7 = auVar11._0_4_ * 255.0;
  fVar4 = auVar11._4_4_ * 255.0;
  uVar8 = (uint)fVar7;
  uVar9 = (uint)fVar4;
  pixels[uVar3] =
       ((int)(fVar4 - 2.1474836e+09) & (int)uVar9 >> 0x1f | uVar9) * 0x10000 +
       ((int)(fVar7 - 2.1474836e+09) & (int)uVar8 >> 0x1f | uVar8) * 0x100 +
       (int)(long)(fVar2 * 255.0);
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y,
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera, RayStats& stats)
{
  Vec3fa color = renderPixelStandard(data,(float)x,(float)y,camera,stats);

  /* write color to framebuffer */
  Vec3ff accu_color = data.g_accu[y*width+x] + Vec3ff(color.x,color.y,color.z,1.0f); data.g_accu[y*width+x] = accu_color;
  float f = rcp(max(1.f,accu_color.w));
  unsigned int r = (unsigned int) (255.0f * clamp(accu_color.x*f,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(accu_color.y*f,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(accu_color.z*f,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}